

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom.c
# Opt level: O0

int igsc_image_oprom_has_4ids_extension
              (igsc_oprom_image *img,uint32_t request_type,_Bool *has_4ids_extension)

{
  _Bool _Var1;
  _Bool *has_4ids_extension_local;
  uint32_t request_type_local;
  igsc_oprom_image *img_local;
  
  if ((img == (igsc_oprom_image *)0x0) || (has_4ids_extension == (_Bool *)0x0)) {
    img_local._4_4_ = 3;
  }
  else if ((request_type == 2) || (request_type == 1)) {
    _Var1 = image_oprom_has_4ids_extension(img,request_type);
    *has_4ids_extension = _Var1;
    img_local._4_4_ = 0;
  }
  else {
    img_local._4_4_ = 3;
  }
  return img_local._4_4_;
}

Assistant:

int igsc_image_oprom_has_4ids_extension(IN struct igsc_oprom_image *img,
                                        IN uint32_t request_type,
                                        OUT bool *has_4ids_extension)
{
    if (img == NULL || has_4ids_extension == NULL)
    {
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    if (request_type != IGSC_OPROM_CODE && request_type != IGSC_OPROM_DATA)
    {
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    *has_4ids_extension = image_oprom_has_4ids_extension(img, request_type);
    return IGSC_SUCCESS;
}